

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

bool __thiscall Task::contains(Task *this,OperandHandle *operand,bool is_out)

{
  bool bVar1;
  reference __a;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *local_78;
  OperandUsage *usage;
  iterator __end1;
  iterator __begin1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> vec;
  bool is_out_local;
  OperandHandle *operand_local;
  Task *this_local;
  
  if (is_out) {
    local_78 = &this->outs;
  }
  else {
    local_78 = &this->ins;
  }
  vec.super__Vector_base<OperandUsage,_std::allocator<OperandUsage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = is_out;
  std::vector<OperandUsage,_std::allocator<OperandUsage>_>::vector
            ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)&__range1,local_78);
  __end1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin
                     ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)&__range1);
  usage = (OperandUsage *)
          std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end
                    ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)&__range1);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                *)&usage);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_001a8166:
      std::vector<OperandUsage,_std::allocator<OperandUsage>_>::~vector
                ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)&__range1);
      return this_local._7_1_;
    }
    __a = __gnu_cxx::
          __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
          ::operator*(&__end1);
    bVar1 = std::operator==(&__a->operand,operand);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_001a8166;
    }
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

bool contains(const OperandHandle &operand, bool is_out=true) const {
        auto vec = is_out ? outs : ins;
        for (auto &usage: vec) {
            if (usage.operand == operand) {
                return true;
            }
        }
        return false;
    }